

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

value_type * __thiscall
QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::takeLast
          (QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this)

{
  QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *in_RSI;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *in_RDI;
  value_type *v;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *in_stack_ffffffffffffffc8;
  
  (in_RDI->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
       (_func_int **)0xaaaaaaaaaaaaaaaa;
  (in_RDI->first).d.d.ptr = (QHttpNetworkRequestPrivate *)0xaaaaaaaaaaaaaaaa;
  in_RDI->second = (QHttpNetworkReply *)0xaaaaaaaaaaaaaaaa;
  last((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)in_stack_ffffffffffffffc8);
  std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair(in_RDI,in_stack_ffffffffffffffc8);
  QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::operator->(in_RSI);
  QtPrivate::QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::eraseLast
            ((QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)in_RDI);
  return in_RDI;
}

Assistant:

value_type takeLast() { Q_ASSERT(!isEmpty()); value_type v = std::move(last()); d->eraseLast(); return v; }